

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::TypedExpectation<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>::
~TypedExpectation(TypedExpectation<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *this
                 )

{
  linked_ptr<testing::ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>_>
  *this_00;
  pointer ppvVar1;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002f9608;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar1 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar1 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar1 = ppvVar1 + 1) {
    this_00 = (linked_ptr<testing::ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>_>
               *)*ppvVar1;
    if (this_00 !=
        (linked_ptr<testing::ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>_>
         *)0x0) {
      linked_ptr<testing::ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>_>
      ::~linked_ptr(this_00);
      operator_delete(this_00,0x10);
    }
  }
  linked_ptr<testing::ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>_>
  ::~linked_ptr(&(this->repeated_action_).impl_);
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<fmt::BasicStringRef<char>,_int,_int>_&>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002f7398;
  linked_ptr<const_testing::MatcherInterface<const_std::tuple<fmt::BasicStringRef<char>,_int,_int>_&>_>
  ::~linked_ptr(&(this->extra_matcher_).
                 super_MatcherBase<const_std::tuple<fmt::BasicStringRef<char>,_int,_int>_&>.impl_);
  (this->matchers_).
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
  .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3010;
  linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_>::~linked_ptr
            (&(this->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
              .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>.
              _M_head_impl.super_MatcherBase<fmt::BasicStringRef<char>_>.impl_);
  (this->matchers_).
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
  .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002f24e8;
  linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            (&(this->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
              .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
              super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.
              super_MatcherBase<int>.impl_);
  (this->matchers_).
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
  .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Tuple_impl<2UL,_testing::Matcher<int>_>.super__Head_base<2UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002f24e8;
  linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             ((long)&(this->matchers_).
                     super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
                     .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
                     super__Tuple_impl<2UL,_testing::Matcher<int>_>.
                     super__Head_base<2UL,_testing::Matcher<int>,_false>._M_head_impl.
                     super_MatcherBase<int> + 8));
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

virtual ~TypedExpectation() {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }